

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p2sc_stdlib.c
# Opt level: O0

void glib_logger(gchar *log_domain,GLogLevelFlags log_level,gchar *message,gpointer user_data)

{
  uint in_ESI;
  int level;
  uint local_24;
  
  if ((in_ESI & 0xe0) == 0) {
    if ((in_ESI & 0x10) == 0) {
      local_24 = 4000;
    }
    else {
      local_24 = 3000;
    }
  }
  else {
    local_24 = 2000;
  }
  _p2sc_msg("glib_logger",
            "/workspace/llm4binary/github/license_all_cmakelists_25/Helioviewer-Project[P]fits2img/libsidc/libp2sc/p2sc_stdlib.c"
            ,0x38,"$Id: p2sc_stdlib.c 5108 2014-06-19 12:29:23Z bogdan $",(int)(ulong)local_24,
            "%s: %s");
  if (local_24 < 4000) {
    return;
  }
  exit(1);
}

Assistant:

static void glib_logger(const gchar *log_domain, GLogLevelFlags log_level,
                        const gchar *message, gpointer user_data G_GNUC_UNUSED) {
    int level;

    if (log_level & (G_LOG_LEVEL_DEBUG | G_LOG_LEVEL_INFO | G_LOG_LEVEL_MESSAGE))
        level = LVL_MESSAGE;
    else if (log_level & G_LOG_LEVEL_WARNING)
        level = LVL_WARNING;
    else
        level = LVL_FATAL;

    P2SC_Msg(level, "%s: %s", log_domain, message);
}